

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O2

void DebugRegisterWindow(CDebugWindow *wnd)

{
  g_debugOutputFlags = (g_debugOutputFlags & 0xfffffffbU) + (uint)(wnd != (CDebugWindow *)0x0) * 4;
  g_debugWindow = wnd;
  return;
}

Assistant:

void DebugRegisterWindow(CDebugWindow *wnd)
{
    if (wnd==NULL) {
        g_debugOutputFlags &= ~DBG_DEBUGWINDOW;
        g_debugWindow= wnd;
    }
    else {
        g_debugWindow= wnd;
        g_debugOutputFlags |= DBG_DEBUGWINDOW;
    }
}